

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_EmbeddedFile::CImpl::LoadFile(CImpl *this,wchar_t *filename)

{
  FILE *fp;
  size_t len;
  ON__UINT64 OVar1;
  bool bVar2;
  
  fp = ON_FileStream::Open(filename,L"rb");
  if (fp == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    ON_FileStream::SeekFromEnd(fp,0);
    len = ON_FileStream::CurrentPosition(fp);
    ON_FileStream::SeekFromStart(fp,0);
    Data::SetLength(&this->m_data,len);
    OVar1 = ON_FileStream::Read(fp,(this->m_data).m_length,
                                (this->m_data).m_buffer._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    bVar2 = OVar1 == (this->m_data).m_length;
    (this->m_data).m_error = !bVar2;
    ON_FileStream::Close(fp);
  }
  return bVar2;
}

Assistant:

bool ON_EmbeddedFile::CImpl::LoadFile(const wchar_t* filename)
{
  auto& d = m_data;

  // Open the file.
  FILE* pFile = ON_FileStream::Open(filename, L"rb");
  if (nullptr == pFile)
    return false;

  // Get the length of the file data.
  ON_FileStream::SeekFromEnd(pFile, 0);
  const size_t data_length = size_t(ON_FileStream::CurrentPosition(pFile));
  ON_FileStream::SeekFromStart(pFile, 0);

  // Allocate a buffer for the file data.
  d.SetLength(data_length);

  // Read the file data into the buffer.
  const bool bOK = (ON_FileStream::Read(pFile, d.m_length, d.m_buffer.get()) == d.m_length);

  d.m_error = !bOK;

  // Close the file.
  ON_FileStream::Close(pFile);

  return bOK;
}